

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O3

bool __thiscall FM::OPNA::Init(OPNA *this,uint c,uint r,bool ipflag,char *path)

{
  uint uVar1;
  uint8 *puVar2;
  long lVar3;
  
  (this->super_OPNABase).super_OPNBase.rate = 8000;
  LoadRhythmSample(this,path);
  if ((this->super_OPNABase).adpcmbuf == (uint8 *)0x0) {
    puVar2 = (uint8 *)operator_new__(0x40000);
    (this->super_OPNABase).adpcmbuf = puVar2;
  }
  OPNABase::SetRate(&this->super_OPNABase,c,r,false);
  lVar3 = 0x13dc;
  do {
    uVar1 = *(int *)((this->super_OPNABase).super_OPNBase.super_Timer.regta + lVar3 + -10) << 10;
    *(uint *)((this->super_OPNABase).super_OPNBase.super_Timer.regta + lVar3 + -0xe) = uVar1 / r;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0x149c);
  OPNABase::Init(&this->super_OPNABase,c,uVar1 % r,false);
  (*(this->super_OPNABase).super_OPNBase.super_Timer._vptr_Timer[3])(this);
  (this->super_OPNABase).adpcmvol = 0x10000;
  (this->super_OPNABase).adpcmvolume = (this->super_OPNABase).adpcmlevel << 4;
  this->rhythmtvol = 0;
  this->rhythm[0].volume = 0;
  return true;
}

Assistant:

bool OPNA::Init(uint c, uint r, bool ipflag, const char* path)
{
	rate = 8000;
	LoadRhythmSample(path);

	if (!adpcmbuf)
		adpcmbuf = new uint8[0x40000];
	if (!adpcmbuf)
		return false;

	if (!SetRate(c, r, ipflag))
		return false;
	if (!OPNABase::Init(c, r, ipflag))
		return false;

	Reset();

	SetVolumeADPCM(0);
	SetVolumeRhythmTotal(0);
	for (int i=0; i<6; i++)
		SetVolumeRhythm(0, 0);
	return true;
}